

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O2

Position * iDynTree::Position::compose(Position *__return_storage_ptr__,Position *op1,Position *op2)

{
  double dVar1;
  double dVar2;
  
  Position(__return_storage_ptr__);
  dVar1 = (op1->super_Vector3).m_data[1];
  dVar2 = (op2->super_Vector3).m_data[1];
  (__return_storage_ptr__->super_Vector3).m_data[0] =
       (op2->super_Vector3).m_data[0] + (op1->super_Vector3).m_data[0];
  (__return_storage_ptr__->super_Vector3).m_data[1] = dVar2 + dVar1;
  (__return_storage_ptr__->super_Vector3).m_data[2] =
       (op1->super_Vector3).m_data[2] + (op2->super_Vector3).m_data[2];
  return __return_storage_ptr__;
}

Assistant:

Position Position::compose(const Position& op1, const Position& op2)
    {
        Position result;
        result(0) = op1(0) + op2(0);
        result(1) = op1(1) + op2(1);
        result(2) = op1(2) + op2(2);
        return result;
    }